

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::BitpackingInitAnalyze<duckdb::hugeint_t>(ColumnData *col_data,PhysicalType type)

{
  BitpackingMode BVar1;
  DatabaseInstance *db;
  DBConfig *pDVar2;
  pointer pBVar3;
  undefined7 in_register_00000031;
  CompressionInfo info;
  _func_int **local_30;
  CompressionInfo local_28;
  
  db = ColumnData::GetDatabase((ColumnData *)CONCAT71(in_register_00000031,type));
  pDVar2 = DBConfig::GetConfig(db);
  local_28.block_manager = ((ColumnData *)CONCAT71(in_register_00000031,type))->block_manager;
  make_uniq<duckdb::BitpackingAnalyzeState<duckdb::hugeint_t>,duckdb::CompressionInfo&>
            ((duckdb *)&local_30,&local_28);
  BVar1 = (pDVar2->options).force_bitpacking_mode;
  pBVar3 = unique_ptr<duckdb::BitpackingAnalyzeState<duckdb::hugeint_t>,_std::default_delete<duckdb::BitpackingAnalyzeState<duckdb::hugeint_t>_>,_true>
           ::operator->((unique_ptr<duckdb::BitpackingAnalyzeState<duckdb::hugeint_t>,_std::default_delete<duckdb::BitpackingAnalyzeState<duckdb::hugeint_t>_>,_true>
                         *)&local_30);
  (pBVar3->state).mode = BVar1;
  col_data->_vptr_ColumnData = local_30;
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)col_data;
}

Assistant:

unique_ptr<AnalyzeState> BitpackingInitAnalyze(ColumnData &col_data, PhysicalType type) {
	auto &config = DBConfig::GetConfig(col_data.GetDatabase());

	CompressionInfo info(col_data.GetBlockManager());
	auto state = make_uniq<BitpackingAnalyzeState<T>>(info);
	state->state.mode = config.options.force_bitpacking_mode;

	return std::move(state);
}